

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Data_Query_R_PDU.cpp
# Opt level: O0

KString * __thiscall
KDIS::PDU::Data_Query_R_PDU::GetAsString_abi_cxx11_
          (KString *__return_storage_ptr__,Data_Query_R_PDU *this)

{
  bool bVar1;
  ostream *poVar2;
  reference puVar3;
  __normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
  local_270;
  const_iterator citrVarEnd;
  const_iterator citrVar;
  const_iterator citrFixedEnd;
  const_iterator citrFixed;
  KString local_230;
  KString local_210;
  KString local_1f0;
  KString local_1c0;
  stringstream local_1a0 [8];
  KStringStream ss;
  ostream local_190 [376];
  Data_Query_R_PDU *local_18;
  Data_Query_R_PDU *this_local;
  
  local_18 = this;
  this_local = (Data_Query_R_PDU *)__return_storage_ptr__;
  std::__cxx11::stringstream::stringstream(local_1a0);
  Header7::GetAsString_abi_cxx11_(&local_1c0,(Header7 *)this);
  poVar2 = std::operator<<(local_190,(string *)&local_1c0);
  poVar2 = std::operator<<(poVar2,"-Data Query PDU-R-\n");
  Simulation_Management_Header::GetAsString_abi_cxx11_
            (&local_1f0,(Simulation_Management_Header *)this);
  poVar2 = std::operator<<(poVar2,(string *)&local_1f0);
  Reliability_Header::GetAsString_abi_cxx11_(&local_210,&this->super_Reliability_Header);
  poVar2 = std::operator<<(poVar2,(string *)&local_210);
  poVar2 = std::operator<<(poVar2,"Request ID:                   ");
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,(this->super_Data_Query_PDU).m_ui32RequestID);
  poVar2 = std::operator<<(poVar2,"\nTime Interval:            \n");
  DATA_TYPE::TimeStamp::GetAsString_abi_cxx11_
            ((KString *)&citrFixed,&(this->super_Data_Query_PDU).m_TimeInterval);
  UTILS::IndentString(&local_230,(KString *)&citrFixed,1,'\t');
  poVar2 = std::operator<<(poVar2,(string *)&local_230);
  poVar2 = std::operator<<(poVar2,"\nNumber Fixed Datum:         ");
  poVar2 = (ostream *)
           std::ostream::operator<<(poVar2,(this->super_Data_Query_PDU).m_ui32NumFixedDatum);
  poVar2 = std::operator<<(poVar2,"\nNumber Variable Datum:      ");
  poVar2 = (ostream *)
           std::ostream::operator<<(poVar2,(this->super_Data_Query_PDU).m_ui32NumVariableDatum);
  std::operator<<(poVar2,"\n");
  std::__cxx11::string::~string((string *)&local_230);
  std::__cxx11::string::~string((string *)&citrFixed);
  std::__cxx11::string::~string((string *)&local_210);
  std::__cxx11::string::~string((string *)&local_1f0);
  std::__cxx11::string::~string((string *)&local_1c0);
  std::operator<<(local_190,"Fixed Datum ID\'s\n");
  citrFixedEnd = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::begin
                           (&(this->super_Data_Query_PDU).m_vFixedDatum);
  citrVar = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::end
                      (&(this->super_Data_Query_PDU).m_vFixedDatum);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=(&citrFixedEnd,&citrVar);
    if (!bVar1) break;
    poVar2 = std::operator<<(local_190,"\t");
    puVar3 = __gnu_cxx::
             __normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
             ::operator*(&citrFixedEnd);
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,*puVar3);
    std::operator<<(poVar2,"\n");
    __gnu_cxx::
    __normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
    ::operator++(&citrFixedEnd);
  }
  std::operator<<(local_190,"Variable Datum ID\'s\n");
  citrVarEnd = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::begin
                         (&(this->super_Data_Query_PDU).m_vVariableDatum);
  local_270._M_current =
       (uint *)std::vector<unsigned_int,_std::allocator<unsigned_int>_>::end
                         (&(this->super_Data_Query_PDU).m_vVariableDatum);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=(&citrVarEnd,&local_270);
    if (!bVar1) break;
    poVar2 = std::operator<<(local_190,"\t");
    puVar3 = __gnu_cxx::
             __normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
             ::operator*(&citrVarEnd);
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,*puVar3);
    std::operator<<(poVar2,"\n");
    __gnu_cxx::
    __normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
    ::operator++(&citrVarEnd);
  }
  std::__cxx11::stringstream::str();
  std::__cxx11::stringstream::~stringstream(local_1a0);
  return __return_storage_ptr__;
}

Assistant:

KString Data_Query_R_PDU::GetAsString() const
{
    KStringStream ss;

    ss << Header::GetAsString()
       << "-Data Query PDU-R-\n"
       << Simulation_Management_Header::GetAsString()
       << Reliability_Header::GetAsString()
       << "Request ID:                   " << m_ui32RequestID
       << "\nTime Interval:            \n" << IndentString( m_TimeInterval.GetAsString() )
       << "\nNumber Fixed Datum:         " << m_ui32NumFixedDatum
       << "\nNumber Variable Datum:      " << m_ui32NumVariableDatum
       << "\n";

    ss << "Fixed Datum ID's\n";
    vector<KUINT32>::const_iterator citrFixed = m_vFixedDatum.begin();
    vector<KUINT32>::const_iterator citrFixedEnd = m_vFixedDatum.end();
    for( ; citrFixed != citrFixedEnd; ++citrFixed )
    {
        ss << "\t" << *citrFixed << "\n";
    }

    ss << "Variable Datum ID's\n";
    vector<KUINT32>::const_iterator citrVar = m_vVariableDatum.begin();
    vector<KUINT32>::const_iterator citrVarEnd = m_vVariableDatum.end();
    for( ; citrVar != citrVarEnd; ++citrVar )
    {
        ss << "\t" << *citrVar << "\n";
    }


    return ss.str();
}